

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

void Mop_ManReduce(Mop_Man_t *p)

{
  void *__ptr;
  int iVar1;
  int iVar2;
  Vec_Wec_t *__ptr_00;
  long lVar3;
  uint uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  Vec_Int_t *vGroup2;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *vGroup;
  timespec ts;
  uint local_84;
  long local_58;
  timespec local_50;
  Vec_Int_t *local_40;
  ulong local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    local_58 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  __ptr_00 = Mop_ManCreateGroups(p);
  lVar3 = (long)p->vCubes->nSize;
  uVar7 = 0;
  uVar14 = 0;
  if (0 < lVar3) {
    uVar4 = p->nWordsOut;
    lVar8 = 0;
    uVar14 = 0;
    do {
      uVar9 = p->vCubes->pArray[lVar8] * uVar4;
      if (((int)uVar9 < 0) || (p->vWordsOut->nSize <= (int)uVar9)) goto LAB_00335544;
      if ((int)uVar4 < 1) {
        iVar1 = 0;
      }
      else {
        uVar11 = 0;
        iVar1 = 0;
        do {
          uVar12 = p->vWordsOut->pArray[uVar9 + uVar11];
          uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
          uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
          uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
          uVar12 = (uVar12 >> 8) + uVar12;
          lVar5 = (uVar12 >> 0x10) + uVar12;
          iVar1 = iVar1 + ((int)((ulong)lVar5 >> 0x20) + (int)lVar5 & 0xffU);
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      uVar14 = uVar14 + iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar3);
  }
  iVar1 = __ptr_00->nSize;
  uVar11 = (ulong)iVar1;
  if (0 < (long)uVar11) {
    pVVar6 = __ptr_00->pArray;
    uVar7 = 0;
    uVar12 = uVar11;
    do {
      iVar2 = Mop_ManRemoveIdentical(p,pVVar6);
      uVar7 = uVar7 + iVar2;
      pVVar6 = pVVar6 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  local_84 = 0;
  uVar4 = 0;
  if (0 < iVar1) {
    pVVar6 = __ptr_00->pArray;
    local_38 = 0;
    uVar12 = 1;
    uVar4 = 0;
    local_40 = pVVar6;
    do {
      pVVar6 = pVVar6 + 1;
      uVar15 = local_38 + 1;
      if (uVar15 < uVar11) {
        vGroup = local_40 + local_38;
        vGroup2 = pVVar6;
        uVar13 = uVar11;
        local_38 = uVar15;
        do {
          iVar2 = Mop_ManMergeContainTwo(p,vGroup,vGroup2);
          uVar4 = uVar4 + iVar2;
          vGroup2 = vGroup2 + 1;
          uVar13 = uVar13 - 1;
          uVar15 = local_38;
        } while (uVar12 != uVar13);
      }
      local_38 = uVar15;
      uVar12 = uVar12 + 1;
    } while (local_38 != uVar11);
  }
  pVVar6 = p->vCubes;
  if (0 < (long)pVVar6->nSize) {
    uVar9 = p->nWordsOut;
    lVar3 = 0;
    local_84 = 0;
    do {
      uVar10 = pVVar6->pArray[lVar3] * uVar9;
      if (((int)uVar10 < 0) || (p->vWordsOut->nSize <= (int)uVar10)) {
LAB_00335544:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((int)uVar9 < 1) {
        iVar2 = 0;
      }
      else {
        uVar12 = 0;
        iVar2 = 0;
        do {
          uVar15 = p->vWordsOut->pArray[uVar10 + uVar12];
          uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
          uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
          uVar15 = (uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f;
          uVar15 = (uVar15 >> 8) + uVar15;
          lVar8 = (uVar15 >> 0x10) + uVar15;
          iVar2 = iVar2 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      local_84 = local_84 + iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != pVVar6->nSize);
  }
  pVVar6->nSize = 0;
  if (0 < iVar1) {
    pVVar6 = __ptr_00->pArray;
    uVar12 = 0;
    do {
      if (0 < pVVar6[uVar12].nSize) {
        lVar3 = 0;
        do {
          if (pVVar6[uVar12].pArray[lVar3] != -1) {
            Vec_IntPush(p->vCubes,pVVar6[uVar12].pArray[lVar3]);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar6[uVar12].nSize);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  iVar1 = __ptr_00->nCap;
  if (0 < (long)iVar1) {
    pVVar6 = __ptr_00->pArray;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&pVVar6->pArray + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar6->pArray + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  printf("Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ",
         (ulong)(uint)p->vCubes->nSize,(ulong)uVar7,(ulong)uVar4,(ulong)uVar14,(ulong)local_84);
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar3 + local_58) / 1000000.0);
  return;
}

Assistant:

void Mop_ManReduce( Mop_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, nOutLits, nOutLits2, nEqual = 0, nContain = 0;
    Vec_Wec_t * vGroups = Mop_ManCreateGroups( p );
    // initial stats
    nOutLits = Mop_ManCountOutputLits( p );
    // check identical cubes within each group
    Vec_WecForEachLevel( vGroups, vGroup, i )
        nEqual += Mop_ManRemoveIdentical( p, vGroup );
    // check contained cubes
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            nContain += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    // final stats
    nOutLits2 = Mop_ManCountOutputLits( p );
    Mop_ManUnCreateGroups( p, vGroups );
    Vec_WecFree( vGroups );
    // report
    printf( "Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ", Vec_IntSize(p->vCubes), nEqual, nContain, nOutLits, nOutLits2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}